

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNStmFor::gen_code(CTPNStmFor *this,int param_1,int param_2)

{
  CTPNStmEnclosing *pCVar1;
  CTcPrsNode *pCVar2;
  CTPNForIn *pCVar3;
  CTPNStm *substm;
  CTcCodeStream *this_00;
  CTcPrsSymtab *symtab;
  CTcCodeLabel *lbl;
  CTcCodeLabel *lbl_00;
  CTcCodeLabel *lbl_01;
  CTPNForIn **ppCVar4;
  CTPNForIn **ppCVar5;
  
  symtab = CTcCodeStream::set_local_frame(G_cs,(this->super_CTPNStmForBase).symtab_);
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar1 = G_cs->enclosing_;
  G_cs->enclosing_ = (CTPNStmEnclosing *)this;
  pCVar2 = (this->super_CTPNStmForBase).init_expr_;
  if (pCVar2 != (CTcPrsNode *)0x0) {
    (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,1);
  }
  lbl = CTcPrsNode::new_label_here();
  lbl_00 = CTcCodeStream::new_label_fwd(G_cs);
  lbl_01 = CTcCodeStream::new_label_fwd(G_cs);
  ppCVar4 = &(this->super_CTPNStmForBase).in_exprs_;
  ppCVar5 = ppCVar4;
  while (pCVar3 = *ppCVar5, pCVar3 != (CTPNForIn *)0x0) {
    (*(pCVar3->super_CTPNForInBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1a]
    )(pCVar3);
    ppCVar5 = &(pCVar3->super_CTPNForInBase).nxt_;
  }
  pCVar2 = (this->super_CTPNStmForBase).cond_expr_;
  if (pCVar2 != (CTcPrsNode *)0x0) {
    (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x14])(pCVar2,0,lbl_01);
  }
  this->break_lbl_ = lbl_01;
  this->cont_lbl_ = lbl_00;
  substm = (this->super_CTPNStmForBase).body_stm_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  CTcPrsNode::def_label_pos(lbl_00);
  pCVar2 = (this->super_CTPNStmForBase).reinit_expr_;
  if (pCVar2 != (CTcPrsNode *)0x0) {
    (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,1);
  }
  while (pCVar3 = *ppCVar4, pCVar3 != (CTPNForIn *)0x0) {
    (*(pCVar3->super_CTPNForInBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1b]
    )(pCVar3);
    ppCVar4 = &(pCVar3->super_CTPNForInBase).nxt_;
  }
  CTcGenTarg::write_op(G_cg,0x91);
  CTcCodeStream::write_ofs2(G_cs,lbl,0);
  CTcPrsNode::def_label_pos(lbl_01);
  this_00 = G_cs;
  G_cs->enclosing_ = pCVar1;
  CTcCodeStream::set_local_frame(this_00,symtab);
  return;
}

Assistant:

void CTPNStmFor::gen_code(int, int)
{
    CTcCodeLabel *top_lbl;
    CTcCodeLabel *end_lbl;
    CTcCodeLabel *cont_lbl;
    CTPNStmEnclosing *old_enclosing;
    CTcPrsSymtab *old_frame;

    /* set my local frame if necessary */
    old_frame = G_cs->set_local_frame(symtab_);

    /* 
     *   add a line record - note that we add the line record after
     *   setting up the local frame, so that the 'for' statement itself
     *   appears within its own inner scope 
     */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);
    
    /* if there's an initializer expression, generate it */
    if (init_expr_ != 0)
        init_expr_->gen_code(TRUE, TRUE);

    /* set the label for the top of the loop */
    top_lbl = new_label_here();

    /* allocate a forward label for 'continue' jumps */
    cont_lbl = G_cs->new_label_fwd();

    /* allocate a forward label for the end of the loop */
    end_lbl = G_cs->new_label_fwd();

    /* generate the implicit conditions for any 'in' clauses */
    for (CTPNForIn *i = in_exprs_ ; i != 0 ; i = i->getnxt())
        i->gen_forstm_cond(end_lbl);

    /* 
     *   If there's an explicit condition clause, generate its code, jumping
     *   to the end of the loop if the condition is false.  
     */
    if (cond_expr_ != 0)
        cond_expr_->gen_code_cond(0, end_lbl);

    /* 
     *   set our labels, so that 'break' and 'continue' statements in our
     *   body will know where to go 
     */
    break_lbl_ = end_lbl;
    cont_lbl_ = cont_lbl;

    /* if we have a body, generate it */
    if (body_stm_ != 0)
        gen_code_substm(body_stm_);

    /* 
     *   add another line record - we're now generating code again for the
     *   original 'for' line, even though it's after the body 
     */
//$$$    add_debug_line_rec();

    /* this is where we come for 'continue' statements */
    def_label_pos(cont_lbl);

    /* generate the reinitializer expression, if we have one */
    if (reinit_expr_ != 0)
        reinit_expr_->gen_code(TRUE, TRUE);

    /* generate the implicit reinitializers for any 'in' clauses */
    for (CTPNForIn *i = in_exprs_ ; i != 0 ; i = i->getnxt())
        i->gen_forstm_reinit();

    /* jump back to the top of the loop */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(top_lbl, 0);

    /* 
     *   we're at the end of the loop - this is where we jump for 'break'
     *   and when the condition becomes false 
     */
    def_label_pos(end_lbl);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);

    /* restore the enclosing local scope */
    G_cs->set_local_frame(old_frame);
}